

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

CURLcode libcurl_generate_mime_part(CURL *curl,GlobalConfig *config,tool_mime *part,int mimeno)

{
  CURL *pCVar1;
  uint uVar2;
  CURLcode CVar3;
  ulong in_RAX;
  char *__ptr;
  tool_mime *toolmime;
  ulong uVar4;
  GlobalConfig *config_00;
  char *fmt;
  char *str;
  int submimeno;
  int slistno;
  CURL *local_38;
  
  config_00 = (GlobalConfig *)((ulong)config & 0xffffffff);
  local_38 = (CURL *)(in_RAX & 0xffffffff00000000);
  str = *(char **)(curl + 0x28);
  if ((*(CURL **)(curl + 0x10) != (CURL *)0x0) &&
     (CVar3 = libcurl_generate_mime_part(*(CURL **)(curl + 0x10),config_00,part,mimeno),
     CVar3 != CURLE_OK)) {
    return CVar3;
  }
  fmt = "part%d = curl_mime_addpart(mime%d);";
  __ptr = (char *)0x0;
  CVar3 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",config_00,config_00);
  if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
  switch(*(undefined4 *)curl) {
  case 1:
    CVar3 = libcurl_generate_mime
                      (curl,(GlobalConfig *)&stack0xffffffffffffffc8,toolmime,
                       (int *)&switchD_0011a80e::switchdataD_00123874);
    pCVar1 = local_38;
    if (CVar3 == CURLE_OK) {
      __ptr = (char *)0x0;
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",config_00,
                           (ulong)local_38 & 0xffffffff);
      if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
      fmt = "mime%d = NULL;";
      __ptr = (char *)0x0;
      uVar4 = (ulong)pCVar1 & 0xffffffff;
LAB_0011a944:
      CVar3 = easysrc_addf(&easysrc_code,fmt,uVar4);
      goto LAB_0011a94b;
    }
    goto LAB_0011aacd;
  case 2:
    __ptr = c_escape(*(char **)(curl + 0x18),(size_t)fmt);
    if (__ptr != (char *)0x0) {
      fmt = "curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);";
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                           config_00,__ptr);
      goto LAB_0011a94b;
    }
    break;
  case 3:
  case 4:
    __ptr = c_escape(*(char **)(curl + 0x18),(size_t)fmt);
    if (__ptr != (char *)0x0) {
      fmt = "curl_mime_filedata(part%d, \"%s\");";
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",
                           (ulong)config & 0xffffffff,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
      if (str == (char *)0x0 && *(int *)curl == 4) {
        fmt = "curl_mime_filename(part%d, NULL);";
        str = (char *)0x0;
        uVar4 = (ulong)config & 0xffffffff;
        goto LAB_0011a944;
      }
      goto LAB_0011a953;
    }
    break;
  case 5:
    if (str == (char *)0x0) {
      str = "-";
    }
  case 6:
    __ptr = (char *)0x0;
    CVar3 = easysrc_addf(&easysrc_code,
                         "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
                         (ulong)config & 0xffffffff);
    if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
    fmt = "                  (curl_seek_callback) fseek, NULL, stdin);";
    CVar3 = easysrc_add(&easysrc_code,"                  (curl_seek_callback) fseek, NULL, stdin);")
    ;
    __ptr = (char *)0x0;
LAB_0011a94b:
    if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
LAB_0011a953:
    if (*(long *)(curl + 0x38) != 0) {
      free(__ptr);
      __ptr = c_escape(*(char **)(curl + 0x38),(size_t)fmt);
      if (__ptr == (char *)0x0) break;
      fmt = "curl_mime_encoder(part%d, \"%s\");";
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
    }
    if (str != (char *)0x0) {
      free(__ptr);
      __ptr = c_escape(str,(size_t)fmt);
      if (__ptr == (char *)0x0) break;
      fmt = "curl_mime_filename(part%d, \"%s\");";
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
    }
    if (*(long *)(curl + 0x20) != 0) {
      free(__ptr);
      __ptr = c_escape(*(char **)(curl + 0x20),(size_t)fmt);
      if (__ptr == (char *)0x0) break;
      fmt = "curl_mime_name(part%d, \"%s\");";
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
    }
    if (*(long *)(curl + 0x30) != 0) {
      free(__ptr);
      __ptr = c_escape(*(char **)(curl + 0x30),(size_t)fmt);
      if (__ptr == (char *)0x0) break;
      CVar3 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",config_00,__ptr);
      if (CVar3 != CURLE_OK) goto LAB_0011a7d8;
    }
    if (*(curl_slist **)(curl + 0x40) == (curl_slist *)0x0) {
      CVar3 = CURLE_OK;
    }
    else {
      CVar3 = libcurl_generate_slist
                        (*(curl_slist **)(curl + 0x40),(int *)((long)register0x00000020 + -0x34));
      if (CVar3 == CURLE_OK) {
        uVar2 = local_38._4_4_;
        CVar3 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, 1);",config_00,
                             (ulong)local_38._4_4_);
        if (CVar3 == CURLE_OK) {
          CVar3 = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)uVar2);
        }
      }
    }
    goto LAB_0011a7d8;
  default:
    __ptr = (char *)0x0;
    goto LAB_0011a953;
  }
  CVar3 = CURLE_OUT_OF_MEMORY;
LAB_0011aacd:
  __ptr = (char *)0x0;
LAB_0011a7d8:
  free(__ptr);
  return CVar3;
}

Assistant:

static CURLcode libcurl_generate_mime_part(CURL *curl,
                                           struct GlobalConfig *config,
                                           tool_mime *part,
                                           int mimeno)
{
  CURLcode ret = CURLE_OK;
  int submimeno = 0;
  char *escaped = NULL;
  const char *data = NULL;
  const char *filename = part->filename;

  /* Parts are linked in reverse order. */
  if(part->prev) {
    ret = libcurl_generate_mime_part(curl, config, part->prev, mimeno);
    if(ret)
      return ret;
  }

  /* Create the part. */
  CODE2("part%d = curl_mime_addpart(mime%d);", mimeno, mimeno);

  switch(part->kind) {
  case TOOLMIME_PARTS:
    ret = libcurl_generate_mime(curl, config, part, &submimeno);
    if(!ret) {
      CODE2("curl_mime_subparts(part%d, mime%d);", mimeno, submimeno);
      CODE1("mime%d = NULL;", submimeno);   /* Avoid freeing in CLEAN. */
    }
    break;

  case TOOLMIME_DATA:
#ifdef CURL_DOES_CONVERSIONS
    /* Data will be set in ASCII, thus issue a comment with clear text. */
    escaped = c_escape(part->data, CURL_ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE1("/* \"%s\" */", escaped);

    /* Our data is always textual: convert it to ASCII. */
    {
      size_t size = strlen(part->data);
      char *cp = malloc(size + 1);

      NULL_CHECK(cp);
      memcpy(cp, part->data, size + 1);
      ret = convert_to_network(cp, size);
      data = cp;
    }
#else
    data = part->data;
#endif
    if(!ret) {
      Curl_safefree(escaped);
      escaped = c_escape(data, CURL_ZERO_TERMINATED);
      NULL_CHECK(escaped);
      CODE2("curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                            mimeno, escaped);
    }
    break;

  case TOOLMIME_FILE:
  case TOOLMIME_FILEDATA:
    escaped = c_escape(part->data, CURL_ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_filedata(part%d, \"%s\");", mimeno, escaped);
    if(part->kind == TOOLMIME_FILEDATA && !filename) {
      CODE1("curl_mime_filename(part%d, NULL);", mimeno);
    }
    break;

  case TOOLMIME_STDIN:
    if(!filename)
      filename = "-";
    /* FALLTHROUGH */
  case TOOLMIME_STDINDATA:
    /* Can only be reading stdin in the current context. */
    CODE1("curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",
          mimeno);
    CODE0("                  (curl_seek_callback) fseek, NULL, stdin);");
    break;
  default:
    /* Other cases not possible in this context. */
    break;
  }

  if(!ret && part->encoder) {
    Curl_safefree(escaped);
    escaped = c_escape(part->encoder, CURL_ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_encoder(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && filename) {
    Curl_safefree(escaped);
    escaped = c_escape(filename, CURL_ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_filename(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->name) {
    Curl_safefree(escaped);
    escaped = c_escape(part->name, CURL_ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_name(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->type) {
    Curl_safefree(escaped);
    escaped = c_escape(part->type, CURL_ZERO_TERMINATED);
    NULL_CHECK(escaped);
    CODE2("curl_mime_type(part%d, \"%s\");", mimeno, escaped);
  }

  if(!ret && part->headers) {
    int slistno;

    ret = libcurl_generate_slist(part->headers, &slistno);
    if(!ret) {
      CODE2("curl_mime_headers(part%d, slist%d, 1);", mimeno, slistno);
      CODE1("slist%d = NULL;", slistno); /* Prevent CLEANing. */
    }
  }

nomem:
#ifdef CURL_DOES_CONVERSIONS
  if(data)
    free((char *) data);
#endif

  Curl_safefree(escaped);
  return ret;
}